

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::Option::remove_needs(Option *this,Option *opt)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<CLI::Option_*> __position;
  
  p_Var1 = &(this->needs_)._M_t._M_impl.super__Rb_tree_header;
  __position = ::std::
               __find_if<std::_Rb_tree_const_iterator<CLI::Option*>,__gnu_cxx::__ops::_Iter_equals_val<CLI::Option*const>>
                         ((this->needs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1
                         );
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::erase_abi_cxx11_((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                        *)&this->needs_,(const_iterator)__position._M_node);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool remove_needs(Option *opt) {
        auto iterator = std::find(std::begin(needs_), std::end(needs_), opt);

        if(iterator == std::end(needs_)) {
            return false;
        }
        needs_.erase(iterator);
        return true;
    }